

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BDVFile.cpp
# Opt level: O1

void decode_bdv(char *buf,size_t buffer_size)

{
  int iVar1;
  size_t sVar2;
  byte bVar3;
  
  if (buffer_size != 0) {
    iVar1 = 0xa0;
    sVar2 = 0;
    do {
      bVar3 = buf[sVar2];
      if (bVar3 == 0xd) {
        iVar1 = iVar1 + (uint)(buf[sVar2 + 1] == '\n');
      }
      if ((0xd < bVar3) || ((0x2401U >> (bVar3 & 0x1f) & 1) == 0)) {
        bVar3 = (char)iVar1 - bVar3;
      }
      if (0x11d < iVar1) {
        iVar1 = 0x9f;
      }
      buf[sVar2] = bVar3;
      sVar2 = sVar2 + 1;
    } while (buffer_size != sVar2);
  }
  return;
}

Assistant:

void decode_bdv(char *buf, size_t buffer_size) {
	int count = 0xa0; // First key
	for (size_t i = 0; i < buffer_size; i++) {
		if (buf[i] == '\r' && buf[i + 1] == '\n') count++; // Increment key on each new line
		char x                                 = buf[i];
		if (!(x == '\r' || x == '\n' || !x)) x = count - x;
		if (count > 285) count                 = 159;
		buf[i]                                 = x;
	}
}